

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O1

void __thiscall
TPZHybridizeHDiv::HybridizeGivenMesh
          (TPZHybridizeHDiv *this,TPZMultiphysicsCompMesh *multiphysics,bool group_elements,
          double Lagrange_term_multiplier)

{
  int iVar1;
  TPZVec<TPZCompMesh_*> *pTVar2;
  
  pTVar2 = TPZMultiphysicsCompMesh::MeshVector(multiphysics);
  ComputePeriferalMaterialIds(this,pTVar2);
  pTVar2 = TPZMultiphysicsCompMesh::MeshVector(multiphysics);
  if ((1 < pTVar2->fNElements) &&
     ((pTVar2->fStore[1]->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    iVar1 = (**(code **)(*(long *)(pTVar2->fStore[1]->fMaterialVec)._M_t._M_impl.
                                  super__Rb_tree_header._M_header._M_left[1]._M_parent + 0x78))();
    this->fNState = iVar1;
  }
  ReCreateMultiphysicsMesh(this,multiphysics,1.0);
  pTVar2 = TPZMultiphysicsCompMesh::MeshVector(multiphysics);
  CreateInterfaceElements(this,&multiphysics->super_TPZCompMesh,pTVar2);
  if (group_elements) {
    GroupandCondenseElements(&multiphysics->super_TPZCompMesh);
    return;
  }
  return;
}

Assistant:

void TPZHybridizeHDiv::HybridizeGivenMesh(TPZMultiphysicsCompMesh &multiphysics, bool group_elements, double Lagrange_term_multiplier)
{
    ComputePeriferalMaterialIds(multiphysics.MeshVector());
    ComputeNState(multiphysics.MeshVector());
    ReCreateMultiphysicsMesh(&multiphysics);
    CreateInterfaceElements(&multiphysics);
    if (group_elements) {
        GroupandCondenseElements(&multiphysics);
    }
}